

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall backward::Colorize::set_color(Colorize *this,type ccode)

{
  ostream *poVar1;
  
  if (this->_enabled == true) {
    poVar1 = std::operator<<(this->_os,"\x1b[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,ccode);
    std::operator<<(poVar1,"m");
    this->_reset = ccode != reset;
  }
  return;
}

Assistant:

void set_color(Color::type ccode) {
    if (!_enabled)
      return;

    // I assume that the terminal can handle basic colors. Seriously I
    // don't want to deal with all the termcap shit.
    _os << "\033[" << static_cast<int>(ccode) << "m";
    _reset = (ccode != Color::reset);
  }